

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

int mbedtls_asn1_write_oid(uchar **p,uchar *start,char *oid,size_t oid_len)

{
  size_t len;
  int ret;
  size_t oid_len_local;
  char *oid_local;
  uchar *start_local;
  uchar **p_local;
  
  p_local._4_4_ = mbedtls_asn1_write_raw_buffer(p,start,(uchar *)oid,oid_len);
  if (-1 < p_local._4_4_) {
    p_local._4_4_ = mbedtls_asn1_write_len_and_tag(p,start,(long)p_local._4_4_,'\x06');
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_write_oid(unsigned char **p, const unsigned char *start,
                           const char *oid, size_t oid_len)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len = 0;

    MBEDTLS_ASN1_CHK_ADD(len, mbedtls_asn1_write_raw_buffer(p, start,
                                                            (const unsigned char *) oid, oid_len));
    return mbedtls_asn1_write_len_and_tag(p, start, len, MBEDTLS_ASN1_OID);
}